

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::PrintInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  uint uVar1;
  ObjdumpState *pOVar2;
  ulong uVar3;
  pointer pbVar4;
  pointer pbVar5;
  char *pcVar6;
  char buffer [40];
  char acStack_38 [40];
  
  switch(expr->type) {
  case I32:
    PrintDetails(this," - init i32=%d\n",(ulong)(expr->value).index);
    return;
  case F32:
    WriteFloatHex(acStack_38,0x14,(expr->value).i32);
    pcVar6 = " - init f32=%s\n";
    break;
  case I64:
    PrintDetails(this," - init i64=%ld\n",(expr->value).i64);
    return;
  case F64:
    WriteDoubleHex(acStack_38,0x28,(expr->value).i64);
    pcVar6 = " - init f64=%s\n";
    break;
  case V128:
    PrintDetails(this," - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",(ulong)(expr->value).index,
                 (ulong)*(uint *)((long)&expr->value + 4),(ulong)*(uint *)((long)&expr->value + 8),
                 (ulong)*(uint *)((long)&expr->value + 0xc));
    return;
  case Global:
    PrintDetails(this," - init global=%u",(ulong)(expr->value).index);
    uVar1 = (expr->value).index;
    pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
    pbVar4 = (pOVar2->global_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (pOVar2->global_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    goto LAB_00128878;
  case FuncRef:
    PrintDetails(this," - init ref.func:%u",(ulong)(expr->value).index);
    uVar1 = (expr->value).index;
    pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
    pbVar4 = (pOVar2->function_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (pOVar2->function_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
LAB_00128878:
    uVar3 = (ulong)uVar1;
    if (uVar3 < (ulong)((long)pbVar5 - (long)pbVar4 >> 5)) {
      if (pbVar4[uVar3]._M_string_length != 0) {
        PrintDetails(this," <%.*s>",pbVar4[uVar3]._M_string_length,pbVar4[uVar3]._M_dataplus._M_p);
      }
    }
    pcVar6 = "\n";
LAB_001288b0:
    PrintDetails(this,pcVar6);
    return;
  case NullRef:
    pcVar6 = " - init nullref\n";
    goto LAB_001288b0;
  default:
    goto switchD_00128771_default;
  }
  PrintDetails(this,pcVar6,acStack_38);
switchD_00128771_default:
  return;
}

Assistant:

void BinaryReaderObjdump::PrintInitExpr(const InitExpr& expr) {
  switch (expr.type) {
    case InitExprType::I32:
      PrintDetails(" - init i32=%d\n", expr.value.i32);
      break;
    case InitExprType::I64:
      PrintDetails(" - init i64=%" PRId64 "\n", expr.value.i64);
      break;
    case InitExprType::F64: {
      char buffer[WABT_MAX_DOUBLE_HEX];
      WriteDoubleHex(buffer, sizeof(buffer), expr.value.f64);
      PrintDetails(" - init f64=%s\n", buffer);
      break;
    }
    case InitExprType::F32: {
      char buffer[WABT_MAX_FLOAT_HEX];
      WriteFloatHex(buffer, sizeof(buffer), expr.value.f32);
      PrintDetails(" - init f32=%s\n", buffer);
      break;
    }
    case InitExprType::V128: {
      PrintDetails(" - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",
                   expr.value.v128_v.u32(0), expr.value.v128_v.u32(1),
                   expr.value.v128_v.u32(2), expr.value.v128_v.u32(3));
      break;
    }
    case InitExprType::Global: {
      PrintDetails(" - init global=%" PRIindex, expr.value.index);
      string_view name = GetGlobalName(expr.value.index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      PrintDetails("\n");
      break;
    }
    case InitExprType::FuncRef: {
      PrintDetails(" - init ref.func:%" PRIindex, expr.value.index);
      string_view name = GetFunctionName(expr.value.index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      PrintDetails("\n");
      break;
    }
    case InitExprType::NullRef: {
      PrintDetails(" - init nullref\n");
      break;
    }
  }
}